

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::loada(VM *this,u2 level_diff,addr_t offset)

{
  int iVar1;
  reference pvVar2;
  int ld;
  ulong uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = CONCAT62(in_register_00000032,level_diff) & 0xffffffff;
  iVar1 = (int)((ulong)((long)(this->_contexts).
                              super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_contexts).
                             super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 6) + -1;
  while( true ) {
    pvVar2 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::at
                       (&this->_contexts,(long)iVar1);
    if ((int)uVar3 < 1) break;
    iVar1 = pvVar2->staticLink;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  PUSH<int>(this,offset + pvVar2->BP);
  return;
}

Assistant:

void VM::loada(u2 level_diff, addr_t offset) {
    int staticLink = _contexts.size()-1;
    for (int ld = level_diff; ld > 0; --ld) {
        staticLink = _contexts.at(staticLink).staticLink;
    }
    addr_t bp = _contexts.at(staticLink).BP;
    PUSH<addr_t>(bp+offset);
}